

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  bool bVar1;
  reference pvVar2;
  float fVar3;
  Vector<float,_3> local_ac;
  Vector<float,_3> local_a0;
  Vector<float,_3> local_94;
  Vector<float,_3> local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  int idx;
  int x;
  int y;
  int endy;
  int endx;
  int starty;
  int startx;
  allocator<tcu::Vector<float,_3>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  bool result;
  vec3 *expected_local;
  int height_local;
  int width_local;
  ComputeShaderBase *this_local;
  
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48,
             (long)(width * height),&local_49);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_49);
  pvVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                     ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                      local_48,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1907
             ,0x1406,pvVar2);
  endx = (int)((float)width * 0.1 + 1.0);
  idx = (int)((float)height * 0.1 + 1.0);
  fVar3 = (float)width * 0.1 + 1.0;
  y = (int)(((float)width - (fVar3 + fVar3)) - 1.0);
  fVar3 = (float)height * 0.1 + 1.0;
  x = (int)(((float)height - (fVar3 + fVar3)) - 1.0);
  endy = idx;
  do {
    if (x <= idx) {
      pvVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)(width * 2 + 2));
      tcu::Vector<float,_3>::Vector(&local_88,0.0);
      bVar1 = ColorEqual(this,pvVar2,&local_88,&this->g_color_eps);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      pvVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)(width * 3 + -3));
      tcu::Vector<float,_3>::Vector(&local_94,0.0);
      bVar1 = ColorEqual(this,pvVar2,&local_94,&this->g_color_eps);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      pvVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)(width + -3 + (height + -3) * width));
      tcu::Vector<float,_3>::Vector(&local_a0,0.0);
      bVar1 = ColorEqual(this,pvVar2,&local_a0,&this->g_color_eps);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      pvVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)((height + -3) * width + 2));
      tcu::Vector<float,_3>::Vector(&local_ac,0.0);
      bVar1 = ColorEqual(this,pvVar2,&local_ac,&this->g_color_eps);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      this_local._7_1_ =
           (bool)(fb.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
LAB_00f7662c:
      local_7c = 1;
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48)
      ;
      return this_local._7_1_;
    }
    for (local_74 = endx; local_74 < y; local_74 = local_74 + 1) {
      local_78 = idx * width + local_74;
      pvVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)local_78);
      bVar1 = ColorEqual(this,pvVar2,expected,&this->g_color_eps);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_00f7662c;
      }
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool			  result = true;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		int startx = int(((float)width * 0.1f) + 1);
		int starty = int(((float)height * 0.1f) + 1);
		int endx   = int((float)width - 2 * (((float)width * 0.1f) + 1) - 1);
		int endy   = int((float)height - 2 * (((float)height * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}